

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O2

void __thiscall EDColor::extractNewSegments(EDColor *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pvVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  allocator_type local_91;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_90;
  EDColor *local_88;
  long local_80;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  validSegments;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> subVec;
  
  validSegments.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  validSegments.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  validSegments.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = &this->segments;
  pvVar5 = (this->segments).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = 0;
  iVar12 = 0;
  local_88 = this;
  do {
    if ((ulong)(((long)(local_88->segments).
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0x18) <= uVar4)
    {
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::operator=(local_90,&validSegments);
      local_88->segmentNo = iVar12;
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&validSegments);
      return;
    }
    local_80 = uVar4 * 0x18;
    lVar11 = 0;
    while( true ) {
      lVar1 = *(long *)((long)&(pvVar5->
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               )._M_impl.super__Vector_impl_data + local_80);
      uVar3 = *(long *)((long)&(pvVar5->
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               )._M_impl.super__Vector_impl_data + local_80 + 8) - lVar1 >> 3;
      if (uVar3 <= (ulong)(long)(int)lVar11) break;
      uVar8 = (long)(int)lVar11 - 1;
      do {
        uVar2 = uVar3;
        if (uVar8 - uVar3 == -1) break;
        lVar11 = uVar8 * 8;
        lVar10 = uVar8 * 8;
        uVar2 = uVar8 + 1;
        uVar8 = uVar2;
      } while (local_88->edgeImg
               [(long)*(int *)(lVar1 + 0xc + lVar11) * (long)local_88->width +
                (long)*(int *)(lVar1 + 8 + lVar10)] == '\0');
      uVar13 = (ulong)(int)uVar2;
      uVar8 = uVar13;
      lVar11 = uVar2 << 0x20;
      uVar6 = uVar13 + 1;
      if (uVar13 + 1 < uVar3) {
        uVar6 = uVar3;
      }
      do {
        lVar10 = lVar11;
        uVar7 = uVar8;
        uVar8 = uVar7 + 1;
        uVar9 = uVar6;
        if (uVar3 <= uVar8) break;
        uVar9 = uVar8;
        lVar11 = lVar10 + 0x100000000;
      } while (local_88->edgeImg
               [(long)*(int *)(lVar1 + 0xc + uVar7 * 8) * (long)local_88->width +
                (long)*(int *)(lVar1 + 8 + uVar7 * 8)] != '\0');
      if (9 < (int)uVar9 - (int)uVar2) {
        subVec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        subVec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        subVec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                  ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                    *)&validSegments,&subVec);
        std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                  ((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&subVec);
        lVar11 = *(long *)((long)&(((local_90->
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                  )._M_impl.super__Vector_impl_data + local_80);
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::vector<cv::Point_<int>*,void>
                  ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&subVec,
                   (Point_<int> *)(lVar11 + uVar13 * 8),(Point_<int> *)((lVar10 >> 0x1d) + lVar11),
                   &local_91);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
                  (validSegments.
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar12,&subVec);
        iVar12 = iVar12 + 1;
        std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                  ((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&subVec);
        pvVar5 = (local_90->
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      lVar11 = uVar7 + 2;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

cv::Mat EDColor::getEdgeImage()
{
	return edgeImage;
}